

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCaseWritter
          (SwiftGenerator *this,EnumDef *ed)

{
  CodeWriter *this_00;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  EnumVal *pEVar4;
  pointer pcVar5;
  long *plVar6;
  size_type *psVar7;
  pointer ppEVar8;
  char cVar9;
  string is_struct;
  string type;
  string variant;
  EnumVal ev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  EnumDef *local_228;
  string local_220;
  string local_200;
  string local_1e0;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined1 local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  IdlNamer *local_160;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  EnumVal local_d8;
  
  local_228 = ed;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"switch type {","");
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  ppEVar8 = (local_228->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar8 < (local_228->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    local_160 = &this->namer_;
    paVar2 = &local_1a0.field_2;
    do {
      pEVar4 = *ppEVar8;
      local_d8.name._M_dataplus._M_p = (pointer)&local_d8.name.field_2;
      pcVar5 = (pEVar4->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar5,pcVar5 + (pEVar4->name)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_d8.doc_comment,&pEVar4->doc_comment);
      local_d8.union_type.base_type = (pEVar4->union_type).base_type;
      local_d8.union_type.element = (pEVar4->union_type).element;
      local_d8.union_type.struct_def = (pEVar4->union_type).struct_def;
      local_d8.union_type.enum_def = (pEVar4->union_type).enum_def;
      local_d8.union_type.fixed_length = (pEVar4->union_type).fixed_length;
      local_d8.union_type._26_6_ = *(undefined6 *)&(pEVar4->union_type).field_0x1a;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&local_d8.attributes,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&pEVar4->attributes);
      std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::vector
                (&local_d8.attributes.vec,&(pEVar4->attributes).vec);
      local_d8.value = pEVar4->value;
      IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_158,local_160,&local_d8);
      GenType_abi_cxx11_(&local_180,this,&local_d8.union_type,false);
      if (local_d8.union_type.base_type == BASE_TYPE_STRUCT) {
        cVar9 = (local_d8.union_type.struct_def)->fixed;
      }
      else {
        cVar9 = '\0';
      }
      if (cVar9 == '\0') {
        local_1a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
      }
      else {
        local_1c0 = &local_1b0;
        local_1b0 = 0x656c626174754d5f;
        local_1b8 = 8;
        local_1a8 = 0;
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_1c0,0,(char *)0x0,
                                    (ulong)local_180._M_dataplus._M_p);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1a0.field_2._M_allocated_capacity = *psVar7;
          local_1a0.field_2._8_8_ = plVar6[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar7;
          local_1a0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1a0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
      }
      if ((cVar9 != '\0') && (local_1c0 != &local_1b0)) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_d8.union_type.base_type != BASE_TYPE_NONE) {
        std::operator+(&local_248,"case .",&local_158);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1e0.field_2._M_allocated_capacity = *psVar7;
          local_1e0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar7;
          local_1e0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1e0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        piVar1 = &(this->code_).cur_ident_lvl_;
        *piVar1 = *piVar1 + 1;
        GenType_abi_cxx11_(&local_248,this,&local_d8.union_type,true);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x382dc4);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_200.field_2._M_allocated_capacity = *psVar7;
          local_200.field_2._8_8_ = plVar6[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar7;
          local_200._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_200._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_248,"return ",&local_1a0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_220.field_2._M_allocated_capacity = *psVar7;
          local_220.field_2._8_8_ = plVar6[3];
        }
        else {
          local_220.field_2._M_allocated_capacity = *psVar7;
          local_220._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_220._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        iVar3 = (this->code_).cur_ident_lvl_;
        if (iVar3 != 0) {
          (this->code_).cur_ident_lvl_ = iVar3 + -1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      SymbolTable<flatbuffers::Value>::~SymbolTable(&local_d8.attributes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8.doc_comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
        operator_delete(local_d8.name._M_dataplus._M_p,
                        local_d8.name.field_2._M_allocated_capacity + 1);
      }
      ppEVar8 = ppEVar8 + 1;
    } while (ppEVar8 < (local_228->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"default: return Offset()","");
  CodeWriter::operator+=(this_00,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"}","");
  CodeWriter::operator+=(this_00,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildUnionEnumSwitchCaseWritter(const EnumDef &ed) {
    code_ += "switch type {";
    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      const auto type = GenType(ev.union_type);
      const auto is_struct = IsStruct(ev.union_type) ? type + Mutable() : type;
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_ += "case ." + variant + ":";
      Indent();
      code_ += "var __obj = value as? " + GenType(ev.union_type, true);
      code_ += "return " + is_struct + ".pack(&builder, obj: &__obj)";
      Outdent();
    }
    code_ += "default: return Offset()";
    code_ += "}";
  }